

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  char cVar3;
  int iVar4;
  ostream *poVar5;
  ulong uVar6;
  Matx<double,_4,_1> *this;
  long lVar7;
  float local_38c;
  string s_distance;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  CascadeClassifier FaceDectector;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> R_face;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> faces;
  undefined8 local_2e0;
  undefined8 local_2d8;
  undefined8 local_2d0;
  VideoCapture cap;
  undefined4 uStack_2c4;
  undefined4 local_260 [2];
  Mat *local_258;
  undefined8 local_250;
  undefined4 local_248;
  undefined4 uStack_244;
  undefined4 uStack_240;
  int iStack_23c;
  undefined8 local_238;
  undefined8 uStack_230;
  string Xml_path;
  undefined8 local_208;
  undefined8 local_200;
  Matx<double,_4,_1> local_1f8;
  Mat frame;
  Mat Reference_image;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  Mat Gray;
  Mat G_Blur;
  
  cv::CascadeClassifier::CascadeClassifier(&FaceDectector);
  cv::Mat::Mat(&frame);
  cv::Mat::Mat(&Gray);
  cv::Mat::Mat(&G_Blur);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&Xml_path,
             "C:/Users/Asadullah/Documents/Projects/CplusPlusDistanceEstimation/haarcascade_frontalface_default.xml"
             ,(allocator<char> *)&Reference_image);
  cVar3 = cv::CascadeClassifier::load((string *)&FaceDectector);
  if (cVar3 == '\0') {
    std::operator<<((ostream *)&std::cout,"erro loading file xml face detector");
    iVar4 = -1;
  }
  else {
    std::operator<<((ostream *)&std::cout,"HarrCascade xml  file is Loaded");
    cv::Mat::Mat(&Reference_image);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&s_distance,
               "C:/Users/Asadullah/Documents/Projects/CplusPlusDistanceEstimation/reference_image.png"
               ,(allocator<char> *)&local_368);
    cv::imread((string *)&cap,(int)&s_distance);
    cv::Mat::operator=(&Reference_image,(Mat *)&cap);
    cv::Mat::~Mat((Mat *)&cap);
    std::__cxx11::string::~string((string *)&s_distance);
    R_face.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    R_face.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    R_face.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    _cap = CONCAT44(uStack_2c4,0x1010000);
    local_200 = 0;
    local_208 = 0;
    this = (Matx<double,_4,_1> *)0x0;
    cv::CascadeClassifier::detectMultiScale
              (0xcccccccd,&FaceDectector,&cap,&R_face,3,0,&local_200,&local_208);
    std::operator<<((ostream *)&std::cout,"before---------------------");
    lVar7 = 0;
    for (uVar6 = 0;
        uVar6 < (ulong)((long)R_face.
                              super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)R_face.
                              super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 4); uVar6 = uVar6 + 1) {
      std::operator<<((ostream *)&std::cout,"reading===========");
      std::ostream::operator<<
                ((ostream *)&std::cout,
                 *(int *)((long)&(R_face.
                                  super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->x + lVar7));
      puVar1 = (undefined8 *)
               ((long)&(R_face.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                        _M_impl.super__Vector_impl_data._M_start)->x + lVar7);
      local_238 = *puVar1;
      uStack_230 = puVar1[1];
      s_distance.field_2._M_allocated_capacity = 0;
      s_distance._M_dataplus._M_p._0_4_ = 0x3010000;
      s_distance._M_string_length = (size_type)&Reference_image;
      cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&cap);
      _cap = 0;
      this = (Matx<double,_4,_1> *)0x8;
      cv::rectangle(&s_distance,&local_238,&cap,2,8,0);
      local_38c = (float)*(int *)((long)&(R_face.
                                          super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->width + lVar7)
      ;
      lVar7 = lVar7 + 0x10;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cap,"reference",(allocator<char> *)&local_368);
    s_distance.field_2._M_allocated_capacity = 0;
    s_distance._M_dataplus._M_p._0_4_ = 0x1010000;
    s_distance._M_string_length = (size_type)&Reference_image;
    cv::imshow((string *)&cap,(_InputArray *)&s_distance);
    std::__cxx11::string::~string((string *)&cap);
    cv::VideoCapture::VideoCapture(&cap);
    cv::VideoCapture::open((int)&cap,2);
    cVar3 = cv::VideoCapture::isOpened();
    if (cVar3 == '\0') {
      std::operator<<((ostream *)&std::cerr,"ERROR! Unable to open camera\n");
      iVar4 = -1;
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cout,"Start grabbing");
      poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<(poVar5,"Press any key to terminate");
      std::endl<char,std::char_traits<char>>(poVar5);
      do {
        iVar4 = (int)this;
        s_distance.field_2._M_allocated_capacity = 0;
        s_distance._M_dataplus._M_p._0_4_ = 0x2010000;
        s_distance._M_string_length = (size_type)&frame;
        cv::VideoCapture::read((_OutputArray *)&cap);
        cVar3 = cv::Mat::empty();
        if (cVar3 != '\0') {
          std::operator<<((ostream *)&std::cerr,"ERROR! blank frame grabbed\n");
          break;
        }
        s_distance.field_2._M_allocated_capacity = 0;
        local_368.field_2._M_allocated_capacity = 0;
        s_distance._M_dataplus._M_p._0_4_ = 0x1010000;
        s_distance._M_string_length = (size_type)&frame;
        local_368._M_dataplus._M_p._0_4_ = 0x2010000;
        local_368._M_string_length = (size_type)&Gray;
        cv::cvtColor((cv *)&s_distance,(_InputArray *)&local_368,(_OutputArray *)0x6,0,iVar4);
        faces.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        faces.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        faces.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        s_distance.field_2._M_allocated_capacity = 0;
        s_distance._M_dataplus._M_p._0_4_ = 0x1010000;
        local_2d0 = 0;
        local_2d8 = 0;
        this = (Matx<double,_4,_1> *)0x0;
        s_distance._M_string_length = (size_type)&Gray;
        cv::CascadeClassifier::detectMultiScale
                  (0xcccccccd,&FaceDectector,&s_distance,&faces,3,0,&local_2d0,&local_2d8);
        lVar7 = 0;
        for (uVar6 = 0;
            uVar6 < (ulong)((long)faces.
                                  super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)faces.
                                  super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4); uVar6 = uVar6 + 1
            ) {
          cord_x = *(int *)((long)&(faces.
                                    super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->x + lVar7);
          cord_y = *(int *)((long)&(faces.
                                    super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->y + lVar7);
          cord_w = *(int *)((long)&(faces.
                                    super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->width + lVar7);
          cord_height = *(int *)((long)&(faces.
                                         super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->height + lVar7)
          ;
          uVar2 = *(undefined8 *)
                   ((long)&(faces.
                            super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                            _M_impl.super__Vector_impl_data._M_start)->y + lVar7);
          uStack_244 = (undefined4)uVar2;
          uStack_240 = (undefined4)((ulong)uVar2 >> 0x20);
          local_248 = *(undefined4 *)
                       ((long)&(faces.
                                super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->x + lVar7);
          local_368.field_2._M_allocated_capacity = 0;
          local_368._M_dataplus._M_p._0_4_ = 0x3010000;
          local_368._M_string_length = (size_type)&frame;
          iStack_23c = cord_height;
          cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&s_distance);
          s_distance._M_dataplus._M_p = (pointer)0x0;
          s_distance._M_string_length = 0x406fe00000000000;
          s_distance.field_2._M_allocated_capacity = 0x406fe00000000000;
          s_distance.field_2._8_8_ = 0;
          cv::rectangle(&local_368,&local_248,&s_distance,2,8,0);
          std::__cxx11::to_string(&s_distance,(((local_38c * 30.1) / 14.3) * 14.3) / (float)cord_w);
          local_250 = 0;
          local_260[0] = 0x3010000;
          local_258 = &frame;
          std::operator+(&local_110,"Distance= ",&s_distance);
          std::operator+(&local_368,&local_110," Inches");
          local_2e0 = 0x3200000032;
          this = &local_1f8;
          cv::Matx<double,_4,_1>::Matx(this);
          local_1f8.val[0] = 255.0;
          local_1f8.val[1] = 0.0;
          local_1f8.val[2] = 255.0;
          local_1f8.val[3] = 0.0;
          cv::putText(0x66666666,local_260,&local_368,&local_2e0);
          std::__cxx11::string::~string((string *)&local_368);
          std::__cxx11::string::~string((string *)&local_110);
          std::__cxx11::string::~string((string *)&s_distance);
          lVar7 = lVar7 + 0x10;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&s_distance,"Gray",(allocator<char> *)&local_110);
        local_368.field_2._M_allocated_capacity = 0;
        local_368._M_dataplus._M_p._0_4_ = 0x1010000;
        local_368._M_string_length = (size_type)&Gray;
        cv::imshow((string *)&s_distance,(_InputArray *)&local_368);
        std::__cxx11::string::~string((string *)&s_distance);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&s_distance,"Live",(allocator<char> *)&local_110);
        local_368.field_2._M_allocated_capacity = 0;
        local_368._M_dataplus._M_p._0_4_ = 0x1010000;
        local_368._M_string_length = (size_type)&frame;
        cv::imshow((string *)&s_distance,(_InputArray *)&local_368);
        std::__cxx11::string::~string((string *)&s_distance);
        iVar4 = cv::waitKey(1);
        std::_Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~_Vector_base
                  (&faces.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>);
      } while (iVar4 < 0);
      iVar4 = 0;
    }
    cv::VideoCapture::~VideoCapture(&cap);
    std::_Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~_Vector_base
              (&R_face.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>);
    cv::Mat::~Mat(&Reference_image);
  }
  std::__cxx11::string::~string((string *)&Xml_path);
  cv::Mat::~Mat(&G_Blur);
  cv::Mat::~Mat(&Gray);
  cv::Mat::~Mat(&frame);
  cv::CascadeClassifier::~CascadeClassifier(&FaceDectector);
  return iVar4;
}

Assistant:

int main(int, char**)

{
    //defining face detector uisng haarcasecde opencv
    //distance calculation data
    int face_width;// it will be width of 

    float focal_length;
    float orginal_distnace = 30.1;// Inches
    float Real_face_width = 14.3; //inches
    float face_width_in_image ;
    float distance;
    // int Distnace_R ;

    //===========
    //face detector object
    CascadeClassifier FaceDectector;
   // Variables 
    double scale_factor;
    int NNB;
   // Mat objects for images 
    Mat frame;
    Mat Gray;
    Mat G_Blur;

    //define the path of xml file
    string Xml_path = "C:/Users/Asadullah/Documents/Projects/CplusPlusDistanceEstimation/haarcascade_frontalface_default.xml";
    if (!FaceDectector.load(Xml_path))
    {
        cout << "erro loading file xml face detector";
        return -1;

    }
    else {
        cout << "HarrCascade xml  file is Loaded";
    }
    Mat Reference_image;
    //reading the reference image from directory
    Reference_image = imread("C:/Users/Asadullah/Documents/Projects/CplusPlusDistanceEstimation/reference_image.png", IMREAD_GRAYSCALE);
    //std::vector<Rect> faces;
    std::vector<Rect> R_face;

    FaceDectector.detectMultiScale(Reference_image, R_face, 1.3);
 
    cout << "before---------------------";
    for (size_t j = 0; j < R_face.size(); j++) {
        cout << "reading===========";
        cout << R_face[j].x;
        Rect bbox = Rect(R_face[j].x, R_face[j].y, R_face[j].width, R_face[j].height);
        rectangle(Reference_image,bbox, Scalar(0, 255, 255), 2, 8, 0);
        face_width_in_image = R_face[j].width;
        

    }
    imshow("reference", Reference_image);
 
    focal_length = FocalLengthFinder(orginal_distnace, Real_face_width, face_width_in_image);

       //--- INITIALIZE VIDEOCAPTURE
    VideoCapture cap;
    // open the default camera using default API
    // cap.open(0);
    // OR advance usage: select any API backend
    int deviceID = 2;             // 0 = open default camera
    int apiID = cv::CAP_ANY;      // 0 = autodetect default API
    // open selected camera using selected API
    cap.open(deviceID, apiID);
    // check if we succeeded
    if (!cap.isOpened()) {
        cerr << "ERROR! Unable to open camera\n";
        return -1;
    }
    //--- GRAB AND WRITE LOOP
    cout << "Start grabbing" << endl
        << "Press any key to terminate" << endl;
    for (;;)
    {
        // wait for a new frame from camera and store it into 'frame'
        cap.read(frame);
        // check if we succeeded
        if (frame.empty()) {
            cerr << "ERROR! blank frame grabbed\n";
            break;
        }
        scale_factor = 1.3;
        NNB = 10;
        int flags = 3;
        // converting the color to gray 
        cvtColor(frame, Gray, COLOR_BGR2GRAY);
        
        // equalizeHist(Gray, Gray);
        // storing the face points in the vector
        vector<Rect> faces;
        FaceDectector.detectMultiScale(Gray, faces,scale_factor);
        for (size_t i = 0; i < faces.size(); i++) {
            //Point center(faces[i].x + faces[i].width / 2, faces[i].y + faces[i].height / 2);
            //ellipse(frame, center, Size(faces[i].width / 2, faces[i].height / 2), 0, 0, 360, Scalar(255, 0, 255), 4);
          //  Mat faceReginOf_intereset = Gray(faces[i]);
            cord_x = faces[i].x; cord_y = faces[i].y; cord_w = faces[i].width; cord_height = faces[i].height;
            //cout << cord_x, cord_y, cord_w, cord_height;
            Rect rec = Rect(faces[i].x, faces[i].y, faces[i].width,faces[i].height);
		    rectangle(frame, rec, Scalar(0, 255, 255), 2, 8, 0);
            distance = Distance_Finder(Real_face_width, focal_length, cord_w);
            // cout << "  ";
            // cout << distance, "  ";
            // Distnace_R = round(distance);
            // cout<<"Distnace = ", Distnace_R<<endl; 
            string s_distance= to_string(distance);
            

            // drwaing the  text on the Screen
            cv::putText(frame, "Distance= "+s_distance+" Inches", cv::Point(50, 50), cv::FONT_HERSHEY_DUPLEX, 0.7, cv::Scalar(255, 0, 255), 2, false);
            // cout << "   ";
            //cout << focal_length;
        
        }

        //GaussianBlur(Gray, G_Blur, Size(3, 3), 0);
        // show live and wait for a key with timeout long enough to show images
        imshow("Gray", Gray);
        imshow("Live", frame);
        if (waitKey(1) >= 0)
            break;
    }
    // the camera will be deinitialized automatically in VideoCapture destructor
    return 0;
}